

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filter_count.c
# Opt level: O1

void test_filter_count(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *paVar3;
  char buff [4096];
  undefined1 local_1028 [4104];
  
  paVar3 = archive_read_new();
  iVar1 = archive_read_support_filter_bzip2(paVar3);
  if (iVar1 == -0x14) {
    wVar2 = canBzip2();
    if (wVar2 != L'\0') goto LAB_00143458;
LAB_00143510:
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_filter_count.c"
                   ,L'\'');
    test_skipping("bzip2 unsupported");
  }
  else {
    if (iVar1 < -0x14) goto LAB_00143510;
LAB_00143458:
    iVar1 = archive_read_support_format_all(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_filter_count.c"
                        ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3
                       );
    extract_reference_file("test_compat_bzip2_1.tbz");
    wVar2 = archive_read_open_filename(paVar3,"test_compat_bzip2_1.tbz",2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_filter_count.c"
                        ,L'.',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 2)",
                        paVar3);
    iVar1 = archive_filter_count(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_filter_count.c"
                        ,L'0',2,"2",(long)iVar1,"archive_filter_count(a)",(void *)0x0);
    archive_read_free(paVar3);
  }
  paVar3 = archive_write_new();
  iVar1 = archive_write_set_format_ustar(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_filter_count.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar3);
  iVar1 = archive_write_set_bytes_per_block(paVar3,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_filter_count.c"
                      ,L'=',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 10)",
                      paVar3);
  wVar2 = archive_write_add_filter_bzip2(paVar3);
  if (wVar2 == L'\xffffffec') {
    wVar2 = canBzip2();
    if (wVar2 == L'\0') {
LAB_00143647:
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_filter_count.c"
                     ,L'A');
      test_skipping("bzip2 unsupported");
      return;
    }
  }
  else if (wVar2 < L'\xffffffec') goto LAB_00143647;
  iVar1 = archive_write_open_memory(paVar3,local_1028,0x1000,(size_t *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_filter_count.c"
                      ,L'D',0,"ARCHIVE_OK",(long)iVar1,"archive_write_open_memory(a, buff, 4096, 0)"
                      ,paVar3);
  iVar1 = archive_filter_count(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_filter_count.c"
                      ,L'F',2,"2",(long)iVar1,"archive_filter_count(a)",(void *)0x0);
  archive_write_free(paVar3);
  return;
}

Assistant:

static void
read_test(const char *name)
{
	struct archive* a = archive_read_new();
	int r;

	r = archive_read_support_filter_bzip2(a);
	if((ARCHIVE_WARN == r && !canBzip2()) || ARCHIVE_WARN > r) {
		skipping("bzip2 unsupported");
		return;
	}

	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));

	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 2));
	/* bzip2 and none */
	assertEqualInt(2, archive_filter_count(a));
	
	archive_read_free(a);
}